

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O0

void __thiscall cp::LegTrack::getLegTrack(LegTrack *this,double t,Pose *r_leg_pose)

{
  uint uVar1;
  Quat *pQVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  Vector3 *trans;
  uint uVar5;
  double dVar6;
  Quaternion<double,_0> local_328;
  Quaternion<double,_0> local_308;
  Quat local_2e8;
  Quaternion<double,_0> local_2c8;
  Quaternion<double,_0> local_2a8;
  Quat local_288;
  Quaternion<double,_0> local_268;
  Quaternion<double,_0> local_248;
  Quat local_228;
  double local_208;
  Matrix<double,_3,_1,_0,_3,_1> local_200;
  Matrix<double,_2,_1,_0,_2,_1> local_1e8;
  Matrix<double,_2,_1,_0,_2,_1> local_1d8;
  undefined1 local_1c8 [8];
  Vector2 nex_1;
  double sst_s_ht;
  double sst_s_time_1;
  Quaternion<double,_0> local_188;
  Quat local_168;
  Quaternion<double,_0> local_148;
  Quaternion<double,_0> local_128;
  Quat local_108;
  Quaternion<double,_0> local_e8;
  Quaternion<double,_0> local_c8;
  Quat local_a8;
  double local_88;
  Matrix<double,_3,_1,_0,_3,_1> local_80;
  Matrix<double,_2,_1,_0,_2,_1> local_68;
  Matrix<double,_2,_1,_0,_2,_1> local_58;
  undefined1 local_48 [8];
  Vector2 nex;
  double sst_s_time;
  rl spl;
  Pose *r_leg_pose_local;
  double t_local;
  LegTrack *this_local;
  
  uVar5 = (uint)(*(int *)(this + 0x440) == 0);
  if ((*(int *)(this + 0x444) == 6) || (*(int *)(this + 0x444) == 4)) {
    Pose::set(r_leg_pose,(Pose *)(this + 0x610));
    Pose::set(r_leg_pose + 1,(Pose *)(this + 0x6f0));
  }
  else {
    if (*(double *)(this + 0x1e8) * 0.5 <= t) {
      if (*(double *)(this + 0x1e8) * 0.5 + *(double *)(this + 0x1e0) * 0.5 <= t) {
        if (*(double *)(this + 0x1e8) * 0.5 + *(double *)(this + 0x1e0) <= t) {
          if (t <= *(double *)(this + 0x1f8)) {
            Pose::set(r_leg_pose + *(uint *)(this + 0x440),
                      (Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x260));
            Pose::set(r_leg_pose + uVar5,(Pose *)(this + (ulong)uVar5 * 0xe0 + 0x260));
          }
        }
        else {
          dVar6 = -*(double *)(this + 0x1e8) * 0.5 + t;
          nex_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
          [1] = -*(double *)(this + 0x1e0) * 0.5 + dVar6;
          Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                    (&local_1d8,(Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x420));
          Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                    (&local_1e8,(Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x430));
          interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::lerp
                    ((interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_1c8,
                     (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x90),&local_1d8,
                     *(double *)(this + 0x1e0),dVar6);
          uVar1 = *(uint *)(this + 0x440);
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_1c8)
          ;
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_1c8)
          ;
          local_208 = interpolation<double>::inter5
                                ((interpolation<double> *)(this + 0x30),
                                 nex_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data.array[1]);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_200,pSVar3,pSVar4,&local_208);
          Pose::set(r_leg_pose + uVar1,&local_200);
          uVar1 = *(uint *)(this + 0x440);
          pQVar2 = Pose::q((Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x610));
          Eigen::Quaternion<double,_0>::Quaternion(&local_248,pQVar2);
          pQVar2 = Pose::q((Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x260));
          Eigen::Quaternion<double,_0>::Quaternion(&local_268,pQVar2);
          interpolation<Eigen::Quaternion<double,_0>_>::lerp
                    (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),
                     &local_248,&local_268,*(double *)(this + 0x1e0),dVar6);
          Pose::set(r_leg_pose + uVar1,&local_228);
          pQVar2 = Pose::q((Pose *)(this + (ulong)uVar5 * 0xe0 + 0x610));
          Eigen::Quaternion<double,_0>::Quaternion(&local_2a8,pQVar2);
          pQVar2 = Pose::q((Pose *)(this + (ulong)uVar5 * 0xe0 + 0x260));
          Eigen::Quaternion<double,_0>::Quaternion(&local_2c8,pQVar2);
          interpolation<Eigen::Quaternion<double,_0>_>::lerp
                    (&local_288,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),
                     &local_2a8,&local_2c8,*(double *)(this + 0x1e0),dVar6);
          Pose::set(r_leg_pose + uVar5,&local_288);
          Eigen::Quaternion<double,_0>::Quaternion
                    (&local_308,(Quaternion<double,_0> *)(this + 0x240));
          Eigen::Quaternion<double,_0>::Quaternion
                    (&local_328,(Quaternion<double,_0> *)(this + 0x220));
          interpolation<Eigen::Quaternion<double,_0>_>::lerp
                    (&local_2e8,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),
                     &local_308,&local_328,*(double *)(this + 0x1e0),dVar6);
          Eigen::Quaternion<double,_0>::operator=
                    ((Quaternion<double,_0> *)(this + 0x200),&local_2e8);
        }
      }
      else {
        dVar6 = -*(double *)(this + 0x1e8) * 0.5 + t;
        Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                  (&local_58,(Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x420));
        Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                  (&local_68,(Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x430));
        interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::lerp
                  ((interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_48,
                   (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x90),&local_58,
                   *(double *)(this + 0x1e0),dVar6);
        uVar1 = *(uint *)(this + 0x440);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                           ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_48);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                           ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_48);
        local_88 = interpolation<double>::inter5((interpolation<double> *)this,dVar6);
        Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_80,pSVar3,pSVar4,&local_88);
        Pose::set(r_leg_pose + uVar1,&local_80);
        uVar1 = *(uint *)(this + 0x440);
        pQVar2 = Pose::q((Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x610));
        Eigen::Quaternion<double,_0>::Quaternion(&local_c8,pQVar2);
        pQVar2 = Pose::q((Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x260));
        Eigen::Quaternion<double,_0>::Quaternion(&local_e8,pQVar2);
        interpolation<Eigen::Quaternion<double,_0>_>::lerp
                  (&local_a8,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_c8
                   ,&local_e8,*(double *)(this + 0x1e0),dVar6);
        Pose::set(r_leg_pose + uVar1,&local_a8);
        pQVar2 = Pose::q((Pose *)(this + (ulong)uVar5 * 0xe0 + 0x610));
        Eigen::Quaternion<double,_0>::Quaternion(&local_128,pQVar2);
        pQVar2 = Pose::q((Pose *)(this + (ulong)uVar5 * 0xe0 + 0x260));
        Eigen::Quaternion<double,_0>::Quaternion(&local_148,pQVar2);
        interpolation<Eigen::Quaternion<double,_0>_>::lerp
                  (&local_108,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),
                   &local_128,&local_148,*(double *)(this + 0x1e0),dVar6);
        Pose::set(r_leg_pose + uVar5,&local_108);
        Eigen::Quaternion<double,_0>::Quaternion(&local_188,(Quaternion<double,_0> *)(this + 0x240))
        ;
        Eigen::Quaternion<double,_0>::Quaternion
                  ((Quaternion<double,_0> *)&sst_s_time_1,(Quaternion<double,_0> *)(this + 0x220));
        interpolation<Eigen::Quaternion<double,_0>_>::lerp
                  (&local_168,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),
                   &local_188,(Quat *)&sst_s_time_1,*(double *)(this + 0x1e0),dVar6);
        Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)(this + 0x200),&local_168);
      }
    }
    else {
      Pose::set(r_leg_pose + *(uint *)(this + 0x440),
                (Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x610));
      pQVar2 = Pose::q((Pose *)(this + (ulong)uVar5 * 0xe0 + 0x610));
      Pose::set(r_leg_pose + uVar5,pQVar2);
    }
    trans = Pose::p((Pose *)(this + (ulong)uVar5 * 0xe0 + 0x610));
    Pose::set(r_leg_pose + uVar5,trans);
  }
  return;
}

Assistant:

void LegTrack::getLegTrack(double t, Pose r_leg_pose[]) {
  rl spl = swl == right ? left : right;
  if (ws == starting1 || ws == stopping2) {
      r_leg_pose[right].set(bfr_landpose[right]);
      r_leg_pose[left].set(bfr_landpose[left]);
  } else {
    if (t < dst_s*0.5) {
        r_leg_pose[swl].set(bfr_landpose[swl]);
        r_leg_pose[spl].set(bfr_landpose[spl].q());
    } else if (t < dst_s*0.5 + sst_s*0.5) {
        double sst_s_time = t - dst_s*0.5;
        Vector2 nex = inter_vec2.lerp(bfr, ref, sst_s, sst_s_time);
        r_leg_pose[swl].set(Vector3(nex.x(), nex.y(), inter_z_1.inter5(sst_s_time)));
        r_leg_pose[swl].set(inter_q.lerp(bfr_landpose[swl].q(), ref_landpose[swl].q(), sst_s, sst_s_time));
        r_leg_pose[spl].set(inter_q.lerp(bfr_landpose[spl].q(), ref_landpose[spl].q(), sst_s, sst_s_time));
        waist = inter_q.lerp(bfr_waist_r, ref_waist_r, sst_s, sst_s_time);
    } else if (t < dst_s*0.5 + sst_s) {
        double sst_s_time = t - dst_s*0.5;
        double sst_s_ht = sst_s_time - sst_s*0.5;
        Vector2 nex = inter_vec2.lerp(bfr, ref, sst_s, sst_s_time);
        r_leg_pose[swl].set(Vector3(nex.x(), nex.y(), inter_z_2.inter5(sst_s_ht)));
        r_leg_pose[swl].set(inter_q.lerp(bfr_landpose[swl].q(), ref_landpose[swl].q(), sst_s, sst_s_time));
        r_leg_pose[spl].set(inter_q.lerp(bfr_landpose[spl].q(), ref_landpose[spl].q(), sst_s, sst_s_time));
        waist = inter_q.lerp(bfr_waist_r, ref_waist_r, sst_s, sst_s_time);
    } else if (t <= st_s) {
        r_leg_pose[swl].set(ref_landpose[swl]);
        r_leg_pose[spl].set(ref_landpose[spl]);
    }
    r_leg_pose[spl].set(bfr_landpose[spl].p());
  }
}